

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawCreateInfoUtil.cpp
# Opt level: O1

MultiSampleState * __thiscall
vkt::Draw::PipelineCreateInfo::MultiSampleState::operator=
          (MultiSampleState *this,MultiSampleState *other)

{
  uint *__first;
  allocator_type local_29;
  void *local_28 [2];
  long local_18;
  
  (this->super_VkPipelineMultisampleStateCreateInfo).sType =
       (other->super_VkPipelineMultisampleStateCreateInfo).sType;
  (this->super_VkPipelineMultisampleStateCreateInfo).pNext =
       (other->super_VkPipelineMultisampleStateCreateInfo).pNext;
  (this->super_VkPipelineMultisampleStateCreateInfo).flags =
       (other->super_VkPipelineMultisampleStateCreateInfo).flags;
  (this->super_VkPipelineMultisampleStateCreateInfo).rasterizationSamples =
       (other->super_VkPipelineMultisampleStateCreateInfo).rasterizationSamples;
  (this->super_VkPipelineMultisampleStateCreateInfo).sampleShadingEnable =
       (other->super_VkPipelineMultisampleStateCreateInfo).sampleShadingEnable;
  (this->super_VkPipelineMultisampleStateCreateInfo).minSampleShading =
       (other->super_VkPipelineMultisampleStateCreateInfo).minSampleShading;
  __first = (other->super_VkPipelineMultisampleStateCreateInfo).pSampleMask;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::vector<unsigned_int_const*,void>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_28,__first,
             __first + ((ulong)(other->super_VkPipelineMultisampleStateCreateInfo).
                               rasterizationSamples + 0x20 >> 5),&local_29);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
            (&this->m_sampleMask,(vector<unsigned_int,std::allocator<unsigned_int>> *)local_28);
  if (local_28[0] != (void *)0x0) {
    operator_delete(local_28[0],local_18 - (long)local_28[0]);
  }
  (this->super_VkPipelineMultisampleStateCreateInfo).pSampleMask =
       (this->m_sampleMask).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start;
  return this;
}

Assistant:

PipelineCreateInfo::MultiSampleState& PipelineCreateInfo::MultiSampleState::operator= (const MultiSampleState& other)
{
	sType = other.sType;
	pNext = other.pNext;
	flags					= other.flags;
	rasterizationSamples	= other.rasterizationSamples;
	sampleShadingEnable		= other.sampleShadingEnable;
	minSampleShading		= other.minSampleShading;

	const size_t sampleMaskArrayLen = (sizeof(vk::VkSampleMask) * 8 + other.rasterizationSamples) / (sizeof(vk::VkSampleMask) * 8);

	m_sampleMask	= std::vector<vk::VkSampleMask>(other.pSampleMask, other.pSampleMask + sampleMaskArrayLen);
	pSampleMask		= &m_sampleMask[0];

	return *this;
}